

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
VectorFormatter<DefaultFormatter>::Unser<DataStream,std::vector<CInv,std::allocator<CInv>>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          vector<CInv,_std::allocator<CInv>_> *v)

{
  pointer pCVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong __nbytes;
  uint64_t __n;
  long in_FS_OFFSET;
  uint32_t obj;
  uint32_t local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = (v->super__Vector_base<CInv,_std::allocator<CInv>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((v->super__Vector_base<CInv,_std::allocator<CInv>_>)._M_impl.super__Vector_impl_data._M_finish
      != pCVar1) {
    (v->super__Vector_base<CInv,_std::allocator<CInv>_>)._M_impl.super__Vector_impl_data._M_finish =
         pCVar1;
  }
  uVar2 = ReadCompactSize<DataStream>(s,true);
  if (uVar2 != 0) {
    __n = 0;
    do {
      uVar3 = __n + 0x21e88;
      __n = uVar2;
      if (uVar3 < uVar2) {
        __n = uVar3;
      }
      __nbytes = uVar3;
      std::vector<CInv,_std::allocator<CInv>_>::reserve(v,__n);
      while ((ulong)(((long)(v->super__Vector_base<CInv,_std::allocator<CInv>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(v->super__Vector_base<CInv,_std::allocator<CInv>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7) < __n) {
        std::vector<CInv,_std::allocator<CInv>_>::emplace_back<>(v);
        pCVar1 = (v->super__Vector_base<CInv,_std::allocator<CInv>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        DataStream::read(s,(int)&local_3c,(void *)0x4,__nbytes);
        pCVar1[-1].type = local_3c;
        DataStream::read(s,(int)pCVar1 + -0x20,(void *)0x20,__nbytes);
      }
    } while (uVar3 < uVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }